

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

void P_RemoveThing(AActor *actor)

{
  bool bVar1;
  AActor *actor_local;
  
  if (((actor->player == (player_t *)0x0) || ((APlayerPawn *)actor != actor->player->mo)) &&
     ((bVar1 = DObject::IsKindOf((DObject *)actor,AInventory::RegistrationInfo.MyClass), !bVar1 ||
      (bVar1 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(actor + 1),(AActor *)0x0), !bVar1))))
  {
    AActor::ClearCounters(actor);
    (*(actor->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  return;
}

Assistant:

void P_RemoveThing(AActor * actor)
{
	// Don't remove live players.
	if (actor->player == NULL || actor != actor->player->mo)
	{
		// Don't also remove owned inventory items
		if (actor->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(actor)->Owner != NULL) return;

		// be friendly to the level statistics. ;)
		actor->ClearCounters();
		actor->Destroy ();
	}

}